

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

Vec_Int_t * Kf_ManCreateFaninCounts(Gia_Man_t *p)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int v;
  int iVar3;
  
  p_00 = Vec_IntAlloc(p->nObjs);
  v = 0;
  do {
    iVar3 = p->nObjs;
    if (iVar3 <= v) {
LAB_005ef51d:
      if (p_00->nSize == iVar3) {
        return p_00;
      }
      __assert_fail("Vec_IntSize(vCounts) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                    ,0x3ea,"Vec_Int_t *Kf_ManCreateFaninCounts(Gia_Man_t *)");
    }
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      iVar3 = p->nObjs;
      goto LAB_005ef51d;
    }
    uVar1 = *(ulong *)pGVar2;
    iVar3 = 0;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      iVar3 = 2 - ((uint)(((undefined1  [12])pGVar2[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)] &
                          (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) +
                  (uint)(((undefined1  [12])pGVar2[-(uVar1 & 0x1fffffff)] &
                         (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff));
    }
    Vec_IntPush(p_00,iVar3);
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Kf_ManCreateFaninCounts( Gia_Man_t * p )  
{
    Vec_Int_t * vCounts;
    Gia_Obj_t * pObj; int i;
    vCounts = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( vCounts, 2 - Gia_ObjIsCi(Gia_ObjFanin0(pObj)) - Gia_ObjIsCi(Gia_ObjFanin1(pObj)) );
        else
            Vec_IntPush( vCounts, 0 );
    }
    assert( Vec_IntSize(vCounts) == Gia_ManObjNum(p) );
    return vCounts;
}